

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

void nfa_closure(DFAState *x)

{
  uint uVar1;
  NFAState *pNVar2;
  NFAState **ppNVar3;
  size_t __nmemb;
  NFAState **ppNVar4;
  ulong uVar5;
  NFAState *pNVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = (x->states).n;
  __nmemb = (size_t)uVar1;
  if (uVar1 != 0) {
    ppNVar3 = (x->states).e;
    uVar9 = 0;
    do {
      ppNVar4 = (x->states).v;
      pNVar6 = ppNVar4[uVar9];
      if ((pNVar6->epsilon).n != 0) {
        pNVar2 = (x->states).v[uVar9];
        uVar8 = 0;
        do {
          uVar1 = (x->states).n;
          uVar5 = (ulong)uVar1;
          if (uVar5 != 0) {
            lVar7 = 0;
            do {
              if ((pNVar6->epsilon).v[uVar8] == ppNVar4[lVar7]) goto LAB_001419f3;
              lVar7 = lVar7 + 1;
            } while (uVar1 != (uint)lVar7);
          }
          if (ppNVar4 == (NFAState **)0x0) {
            pNVar6 = (pNVar2->epsilon).v[uVar8];
            (x->states).v = ppNVar3;
            (x->states).n = uVar1 + 1;
            (x->states).e[uVar5] = pNVar6;
          }
          else {
            if (ppNVar4 == ppNVar3) {
              if (2 < uVar1) goto LAB_001419df;
            }
            else if ((uVar1 & 7) == 0) {
LAB_001419df:
              vec_add_internal(x,(pNVar2->epsilon).v[uVar8]);
              goto LAB_001419f3;
            }
            pNVar6 = (pNVar2->epsilon).v[uVar8];
            (x->states).n = uVar1 + 1;
            ppNVar4[uVar5] = pNVar6;
          }
LAB_001419f3:
          uVar8 = uVar8 + 1;
          ppNVar4 = (x->states).v;
          pNVar6 = ppNVar4[uVar9];
        } while (uVar8 < (pNVar6->epsilon).n);
      }
      uVar9 = uVar9 + 1;
      __nmemb = (size_t)(x->states).n;
    } while (uVar9 < __nmemb);
  }
  ppNVar3 = (x->states).v;
  if (ppNVar3 != (NFAState **)0x0) {
    qsort(ppNVar3,__nmemb,8,nfacmp);
    return;
  }
  return;
}

Assistant:

static void nfa_closure(DFAState *x) {
  uint i, j, k;

  for (i = 0; i < x->states.n; i++) {
    NFAState *s = x->states.v[i];
    for (j = 0; j < x->states.v[i]->epsilon.n; j++) {
      for (k = 0; k < x->states.n; k++)
        if (x->states.v[i]->epsilon.v[j] == x->states.v[k]) goto Lbreak;
      vec_add(&x->states, s->epsilon.v[j]);
    Lbreak:;
    }
  }
  if (x->states.v != NULL) qsort(x->states.v, x->states.n, sizeof(x->states.v[0]), nfacmp);
}